

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O0

int sptk::snack::dp_f0(float *fdata,int buff_size,int sdstep,double freq,F0_params *par,
                      float **f0p_pt,float **vuvp_pt,float **rms_speech_pt,float **acpkp_pt,
                      int *vecsize,int last_time,Buffer *buffer)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Stat *pSVar6;
  frame_rec *pfVar7;
  Frame *pFVar8;
  void *pvVar9;
  int *in_RCX;
  undefined4 in_EDX;
  uint in_ESI;
  float *in_RDI;
  float *in_R8;
  Cross *in_R9;
  float fVar10;
  int *in_XMM0_Qa;
  double dVar11;
  double dVar12;
  long *in_stack_00000008;
  long *in_stack_00000010;
  uint *in_stack_00000018;
  int in_stack_00000020;
  long *in_stack_00000028;
  float den;
  float cnext;
  float cprev;
  float cormax;
  float patherrmin;
  int checkpath_done;
  int frmcnt;
  int best_cand;
  int num_paths;
  Frame *frm_1;
  int *sp2;
  short *sp1;
  float *ftp2;
  float *ftp1;
  Frame *frm;
  Stat *stat;
  int samsds;
  int decimate;
  int minloc;
  int ncandp;
  int ncand;
  int maxloc;
  int nframes;
  int loc2;
  int loc1;
  int k;
  int j;
  int i;
  float errmin;
  float err;
  float ferr;
  float ft1;
  float ftemp;
  float ttemp;
  float *dsdata;
  float *rms_ratio;
  float *sta;
  float engref;
  float maxval;
  int in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  void *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  double in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Buffer *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  float fVar13;
  int in_stack_fffffffffffffed8;
  float fVar14;
  int in_stack_fffffffffffffedc;
  float fVar15;
  undefined4 in_stack_fffffffffffffee0;
  float fVar16;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  uint uVar17;
  int in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  long lVar18;
  long *plVar19;
  int *in_stack_ffffffffffffff00;
  undefined4 *puVar20;
  float *in_stack_ffffffffffffff08;
  undefined2 *puVar21;
  float **in_stack_ffffffffffffff10;
  float *pfVar22;
  float **in_stack_ffffffffffffff18;
  float *pfVar23;
  float **in_stack_ffffffffffffff20;
  float *pfVar24;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  int local_ac;
  int local_a8;
  uint local_a4;
  float local_a0;
  float local_98;
  float in_stack_ffffffffffffff70;
  float local_8c;
  float *engref_00;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float *dbsize;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  pfVar24 = (float *)0x0;
  uVar2 = get_Nframes((long)(int)in_ESI,*(int *)((long)in_stack_00000028 + 0xbc),
                      (int)in_stack_00000028[0xc]);
  if (debug_level != 0) {
    fprintf(_stderr,"******* Computing %d dp frames ******** from %d points\n",(ulong)uVar2,
            (ulong)in_ESI);
  }
  iVar3 = (int)((double)in_XMM0_Qa / 2000.0);
  dbsize = in_RDI;
  if (1 < iVar3) {
    in_stack_ffffffffffffff30 =
         (int)((uVar2 - 1) * (int)in_stack_00000028[0xc] + *(int *)((long)in_stack_00000028 + 0x74))
         / iVar3;
    if (in_stack_ffffffffffffff30 < 1) {
      return 1;
    }
    in_stack_fffffffffffffe50 = (void *)((long)in_stack_00000028 + 0x308c);
    in_stack_fffffffffffffe48 = in_stack_00000020;
    in_RDI = downsample((float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                        (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                        (int)in_stack_fffffffffffffe98,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,
                        in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,
                        in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,pfVar24,
                        (int *)CONCAT44(iVar3,in_stack_ffffffffffffff30));
    if (in_RDI == (float *)0x0) {
      fprintf(_stderr,"can\'t get downsampled data.\n");
      return 1;
    }
  }
  pSVar6 = get_stationarity((float *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            (double)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                            in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                            in_stack_fffffffffffffec8);
  if (pSVar6 == (Stat *)0x0) {
    fprintf(_stderr,"can\'t get stationarity\n");
    iVar3 = 1;
  }
  else {
    pfVar24 = pSVar6->stat;
    engref_00 = pSVar6->rms_ratio;
    if (((int)in_stack_00000028[0x17] == 0) && (0 < (int)uVar2)) {
      *in_stack_00000028 = *(long *)(*in_stack_00000028 + 0x18);
    }
    for (local_a4 = 0; (int)local_a4 < (int)uVar2; local_a4 = local_a4 + 1) {
      if (*in_stack_00000028 == *(long *)(in_stack_00000028[1] + 0x20)) {
        if (5 < (int)in_stack_00000028[4]) {
          fprintf(_stderr,
                  "too many requests (%d) for dynamically allocating space.\n   There may be a problem in finding converged path.\n"
                  ,(ulong)*(uint *)(in_stack_00000028 + 4));
          return 1;
        }
        if (debug_level != 0) {
          fprintf(_stderr,"allocating %d more frames for DP circ. buffer.\n",
                  (ulong)*(uint *)((long)in_stack_00000028 + 0x24));
        }
        pfVar7 = alloc_frame((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                             (int)in_stack_fffffffffffffe50);
        *(frame_rec **)(*in_stack_00000028 + 0x18) = pfVar7;
        pfVar7->prev = (frame_rec *)*in_stack_00000028;
        for (local_ac = 1; local_ac < *(int *)((long)in_stack_00000028 + 0x24);
            local_ac = local_ac + 1) {
          pFVar8 = alloc_frame((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                               (int)in_stack_fffffffffffffe50);
          pfVar7->next = pFVar8;
          pfVar7->next->prev = pfVar7;
          pfVar7 = pfVar7->next;
        }
        pfVar7->next = (frame_rec *)in_stack_00000028[1];
        *(frame_rec **)(in_stack_00000028[1] + 0x20) = pfVar7;
        *(int *)(in_stack_00000028 + 4) = (int)in_stack_00000028[4] + 1;
      }
      *(float *)(*in_stack_00000028 + 0x10) = pSVar6->rms[(int)local_a4];
      in_stack_fffffffffffffe48 = *(int *)((long)in_stack_00000028 + 0x6c);
      in_stack_fffffffffffffe50 =
           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                            (int)in_stack_00000028[0xd]);
      get_fast_cands((float *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (float *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),iVar3,
                     in_stack_ffffffffffffff30,(int)((ulong)pSVar6 >> 0x20),(int)pSVar6,
                     (int)in_stack_ffffffffffffff70,(int)in_RDI,engref_00,(int *)pfVar24,
                     (float *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_R9,
                     in_R8,in_RCX,in_XMM0_Qa,(F0_params *)CONCAT44(in_ESI,in_EDX),(int *)dbsize,
                     (float **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      puVar20 = (undefined4 *)in_stack_00000028[0xf];
      puVar21 = *(undefined2 **)(*(long *)(*in_stack_00000028 + 8) + 8);
      pfVar22 = (float *)in_stack_00000028[0x16];
      pfVar23 = *(float **)(*(long *)(*in_stack_00000028 + 8) + 0x10);
      local_a8 = in_stack_ffffffffffffff40;
      while (local_a8 != 0) {
        *pfVar23 = *pfVar22;
        *puVar21 = (short)*puVar20;
        puVar20 = puVar20 + 1;
        puVar21 = puVar21 + 1;
        pfVar22 = pfVar22 + 1;
        pfVar23 = pfVar23 + 1;
        local_a8 = local_a8 + -1;
      }
      *puVar21 = 0xffff;
      *pfVar23 = in_stack_ffffffffffffff94;
      *(float *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x18) +
                (long)in_stack_ffffffffffffff40 * 4) =
           *(float *)(in_stack_00000028 + 9) + in_stack_ffffffffffffff94;
      for (local_a8 = 0; local_a8 < in_stack_ffffffffffffff40; local_a8 = local_a8 + 1) {
        in_stack_ffffffffffffff70 =
             -(float)*(int *)(in_stack_00000028[0xf] + (long)local_a8 * 4) *
             *(float *)((long)in_stack_00000028 + 0x5c) + 1.0;
        *(float *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x18) + (long)local_a8 * 4) =
             -*(float *)(in_stack_00000028[0x16] + (long)local_a8 * 4) * in_stack_ffffffffffffff70 +
             1.0;
      }
      in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 1;
      **(undefined2 **)(*in_stack_00000028 + 8) = (short)in_stack_ffffffffffffff40;
      in_stack_ffffffffffffff3c = (int)**(short **)(*(long *)(*in_stack_00000028 + 0x20) + 8);
      for (local_ac = 0; local_ac < in_stack_ffffffffffffff40; local_ac = local_ac + 1) {
        in_stack_ffffffffffffff38 = 0;
        local_a0 = 3.4028235e+38;
        iVar4 = (int)*(short *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 8) +
                               (long)local_ac * 2);
        if (iVar4 < 1) {
          for (local_a8 = 0; local_a8 < in_stack_ffffffffffffff3c; local_a8 = local_a8 + 1) {
            if (*(short *)(*(long *)(*(long *)(*(long *)(*in_stack_00000028 + 0x20) + 8) + 8) +
                          (long)local_a8 * 2) < 1) {
              local_98 = 0.0;
            }
            else {
              local_98 = *(float *)((long)in_stack_00000028 + 0x3c) * engref_00[(int)local_a4] +
                         *(float *)(in_stack_00000028 + 8) * pfVar24[(int)local_a4] +
                         *(float *)(in_stack_00000028 + 7);
            }
            local_98 = local_98 +
                       *(float *)(*(long *)(*(long *)(*(long *)(*in_stack_00000028 + 0x20) + 8) +
                                           0x28) + (long)local_a8 * 4);
            if (local_98 < local_a0) {
              in_stack_ffffffffffffff38 = local_a8;
              local_a0 = local_98;
            }
          }
        }
        else {
          for (local_a8 = 0; local_a8 < in_stack_ffffffffffffff3c; local_a8 = local_a8 + 1) {
            iVar5 = (int)*(short *)(*(long *)(*(long *)(*(long *)(*in_stack_00000028 + 0x20) + 8) +
                                             8) + (long)local_a8 * 2);
            if (iVar5 < 1) {
              local_98 = *(float *)(in_stack_00000028 + 8) * pfVar24[(int)local_a4] +
                         *(float *)(in_stack_00000028 + 7) +
                         *(float *)((long)in_stack_00000028 + 0x3c) / engref_00[(int)local_a4];
            }
            else {
              dVar11 = log((double)iVar4 / (double)iVar5);
              in_stack_ffffffffffffff70 = (float)dVar11;
              dVar11 = std::fabs((double)(ulong)(uint)in_stack_ffffffffffffff70);
              fVar10 = *(float *)((long)in_stack_00000028 + 0x4c);
              dVar12 = std::fabs((double)(ulong)(uint)(in_stack_ffffffffffffff70 +
                                                      *(float *)((long)in_stack_00000028 + 0x54)));
              fVar10 = fVar10 + SUB84(dVar12,0);
              local_8c = SUB84(dVar11,0);
              if (fVar10 < SUB84(dVar11,0)) {
                local_8c = fVar10;
              }
              fVar10 = *(float *)((long)in_stack_00000028 + 0x4c);
              dVar11 = std::fabs((double)(ulong)(uint)(in_stack_ffffffffffffff70 -
                                                      *(float *)((long)in_stack_00000028 + 0x54)));
              fVar10 = fVar10 + SUB84(dVar11,0);
              if (fVar10 < local_8c) {
                local_8c = fVar10;
              }
              local_98 = local_8c * *(float *)(in_stack_00000028 + 0xb);
            }
            local_98 = local_98 +
                       *(float *)(*(long *)(*(long *)(*(long *)(*in_stack_00000028 + 0x20) + 8) +
                                           0x28) + (long)local_a8 * 4);
            if (local_98 < local_a0) {
              in_stack_ffffffffffffff38 = local_a8;
              local_a0 = local_98;
            }
          }
        }
        if (((int)in_stack_00000028[0x17] == 0) || (local_a4 != 0)) {
          *(float *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x28) + (long)local_ac * 4) =
               local_a0 +
               *(float *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x18) + (long)local_ac * 4);
          *(short *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x20) + (long)local_ac * 2) =
               (short)in_stack_ffffffffffffff38;
        }
        else {
          *(undefined4 *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x28) + (long)local_ac * 4)
               = *(undefined4 *)
                  (*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x18) + (long)local_ac * 4);
          *(undefined2 *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x20) + (long)local_ac * 2)
               = 0;
        }
      }
      if ((int)local_a4 < (int)(uVar2 - 1)) {
        *in_stack_00000028 = *(long *)(*in_stack_00000028 + 0x18);
      }
      if (1 < debug_level) {
        fprintf(_stderr,"%d engref:%10.0f max:%7.5f loc:%4d\n",(double)in_stack_ffffffffffffff90,
                (double)in_stack_ffffffffffffff94,(ulong)local_a4,(ulong)in_stack_ffffffffffffff44);
      }
    }
    *in_stack_00000018 = 0;
    *(uint *)(in_stack_00000028 + 6) = uVar2 + (int)in_stack_00000028[6];
    if (((int)in_stack_00000028[5] <= (int)in_stack_00000028[6]) || (in_stack_00000020 != 0)) {
      uVar2 = 1;
      if (debug_level != 0) {
        fprintf(_stderr,"available frames for backtracking: %d\n",
                (ulong)*(uint *)(in_stack_00000028 + 6));
      }
      fVar10 = 3.4028235e+38;
      iVar3 = 0;
      iVar4 = (int)**(short **)(*in_stack_00000028 + 8);
      lVar18 = *in_stack_00000028;
      for (local_ac = 0; local_ac < iVar4; local_ac = local_ac + 1) {
        pfVar24 = (float *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x28) + (long)local_ac * 4
                           );
        if (*pfVar24 <= fVar10 && fVar10 != *pfVar24) {
          fVar10 = *(float *)(*(long *)(*(long *)(*in_stack_00000028 + 8) + 0x28) +
                             (long)local_ac * 4);
          iVar3 = local_ac;
        }
        *(int *)(in_stack_00000028[3] + (long)local_ac * 4) =
             (int)*(short *)(*(long *)(*(long *)(lVar18 + 8) + 0x20) + (long)local_ac * 2);
      }
      if (in_stack_00000020 == 0) {
        uVar17 = 0;
        do {
          lVar18 = *(long *)(lVar18 + 0x20);
          uVar17 = uVar17 + 1;
          uVar2 = 1;
          for (local_ac = 1; local_ac < iVar4; local_ac = local_ac + 1) {
            if (*(int *)in_stack_00000028[3] != *(int *)(in_stack_00000028[3] + (long)local_ac * 4))
            {
              uVar2 = 0;
            }
          }
          if (uVar2 != 0) {
            in_stack_00000028[2] = lVar18;
            iVar3 = *(int *)in_stack_00000028[3];
            if (debug_level != 0) {
              fprintf(_stderr,"paths went back %d frames before converging\n",(ulong)uVar17);
            }
            goto LAB_0013880b;
          }
          for (local_ac = 0; local_ac < iVar4; local_ac = local_ac + 1) {
            *(int *)(in_stack_00000028[3] + (long)local_ac * 4) =
                 (int)*(short *)(*(long *)(*(long *)(lVar18 + 8) + 0x20) +
                                (long)*(int *)(in_stack_00000028[3] + (long)local_ac * 4) * 2);
          }
        } while (lVar18 != in_stack_00000028[1]);
        bVar1 = *(int *)((long)in_stack_00000028 + 0x2c) <= (int)in_stack_00000028[6];
        if (bVar1) {
          in_stack_00000028[2] = *in_stack_00000028;
        }
        else {
          in_stack_00000028[2] = 0;
        }
        uVar2 = (uint)bVar1;
      }
      else {
        in_stack_00000028[2] = *in_stack_00000028;
      }
LAB_0013880b:
      local_a4 = 0;
      plVar19 = (long *)in_stack_00000028[2];
      while (plVar19 != *(long **)(in_stack_00000028[1] + 0x20) && uVar2 != 0) {
        if (local_a4 == *(uint *)((long)in_stack_00000028 + 0x34)) {
          *(int *)((long)in_stack_00000028 + 0x34) = *(int *)((long)in_stack_00000028 + 0x34) << 1;
          if (debug_level != 0) {
            fprintf(_stderr,"reallocating space for output frames: %d\n",
                    (ulong)*(uint *)((long)in_stack_00000028 + 0x34));
          }
          pvVar9 = ckrealloc(in_stack_fffffffffffffe50,
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_00000028[0x14] = (long)pvVar9;
          pvVar9 = ckrealloc(in_stack_fffffffffffffe50,
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_00000028[0x12] = (long)pvVar9;
          pvVar9 = ckrealloc(in_stack_fffffffffffffe50,
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_00000028[0x13] = (long)pvVar9;
          pvVar9 = ckrealloc(in_stack_fffffffffffffe50,
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_00000028[0x15] = (long)pvVar9;
        }
        *(int *)(in_stack_00000028[0x14] + (long)(int)local_a4 * 4) = (int)plVar19[2];
        *(undefined4 *)(in_stack_00000028[0x15] + (long)(int)local_a4 * 4) =
             *(undefined4 *)(*(long *)(plVar19[1] + 0x10) + (long)iVar3 * 4);
        iVar4 = (int)*(short *)(*(long *)(plVar19[1] + 8) + (long)iVar3 * 2);
        *(undefined4 *)(in_stack_00000028[0x13] + (long)(int)local_a4 * 4) = 0x3f800000;
        iVar3 = (int)*(short *)(*(long *)(plVar19[1] + 0x20) + (long)iVar3 * 2);
        fVar10 = (float)iVar4;
        if (iVar4 < 1) {
          *(undefined4 *)(in_stack_00000028[0x12] + (long)(int)local_a4 * 4) = 0;
          *(undefined4 *)(in_stack_00000028[0x13] + (long)(int)local_a4 * 4) = 0;
        }
        else {
          if ((*(int *)((long)in_stack_00000028 + 0x6c) < iVar4) &&
             (iVar4 < (int)in_stack_00000028[0xe])) {
            iVar4 = iVar4 - *(int *)((long)in_stack_00000028 + 0x6c);
            fVar16 = *(float *)(*(long *)(*plVar19 + 0x10) + (long)iVar4 * 4);
            fVar15 = *(float *)(*(long *)(*plVar19 + 0x10) + (long)(iVar4 + 1) * 4);
            fVar14 = *(float *)(*(long *)(*plVar19 + 0x10) + (long)(iVar4 + -1) * 4);
            fVar13 = ((fVar15 + fVar14) - (fVar16 + fVar16)) * 2.0;
            dVar11 = std::fabs((double)(ulong)(uint)fVar13);
            if (1e-06 < SUB84(dVar11,0)) {
              fVar10 = (2.0 - (fVar16 * -8.0 + fVar15 * 5.0 + fVar14 * 3.0) / fVar13) + fVar10;
            }
          }
          *(float *)(in_stack_00000028[0x12] + (long)(int)local_a4 * 4) =
               (float)((double)in_XMM0_Qa / (double)fVar10);
        }
        plVar19 = (long *)plVar19[4];
        if (1 < debug_level) {
          fprintf(_stderr," i:%4d%8.1f%8.1f\n",
                  (double)*(float *)(in_stack_00000028[0x12] + (long)(int)local_a4 * 4),
                  (double)*(float *)(in_stack_00000028[0x13] + (long)(int)local_a4 * 4),
                  (ulong)local_a4);
        }
        local_a4 = local_a4 + 1;
      }
      if (uVar2 != 0) {
        *in_stack_00000018 = local_a4;
        in_stack_00000028[1] = *(long *)(in_stack_00000028[2] + 0x18);
        *(uint *)(in_stack_00000028 + 6) = (int)in_stack_00000028[6] - *in_stack_00000018;
      }
    }
    if (debug_level != 0) {
      fprintf(_stderr,"writing out %d frames.\n",(ulong)*in_stack_00000018);
    }
    *(long *)in_R8 = in_stack_00000028[0x12];
    lVar18 = in_stack_00000028[0x13];
    in_R9->rms = (float)(int)lVar18;
    in_R9->maxval = (float)(int)((ulong)lVar18 >> 0x20);
    *in_stack_00000010 = in_stack_00000028[0x15];
    *in_stack_00000008 = in_stack_00000028[0x14];
    if ((int)in_stack_00000028[0x17] != 0) {
      *(undefined4 *)(in_stack_00000028 + 0x17) = 0;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

dp_f0(float *fdata, int buff_size, int sdstep, double freq, F0_params *par,
      float **f0p_pt, float **vuvp_pt, float **rms_speech_pt, float **acpkp_pt,
      int *vecsize, int last_time, Buffer *buffer)
{
  float  maxval, engref, *sta, *rms_ratio, *dsdata;
  float  *downsample(float *input, int samsin, int state_idx, double freq,
                     int *samsout, int decimate, int first_time, int last_time,
                     int *ncoeff, int *ncoefft, float *b, float **foutput,
                     float **co, float **mem, float *state, int *fsize);
  register float ttemp, ftemp, ft1, ferr, err, errmin;
  register int  i, j, k, loc1, loc2;
  int   nframes, maxloc, ncand, ncandp, minloc,
        decimate, samsds;

  Stat *stat = NULL;

  nframes = get_Nframes((long) buff_size, buffer->pad, buffer->step); /* # of whole frames */

  if(debug_level)
    Fprintf(stderr,
	    "******* Computing %d dp frames ******** from %d points\n", nframes, buff_size);

  /* Now downsample the signal for coarse peak estimates. */

  decimate = (int)(freq/2000.0);    /* downsample to about 2kHz */
  if (decimate <= 1)
    dsdata = fdata;
  else {
    samsds = ((nframes-1) * buffer->step + buffer->ncomp) / decimate;
    if (samsds < 1)
      return 1;                     /* skip final frame if it is too small */
    dsdata = downsample(fdata, buff_size, sdstep, freq, &samsds, decimate, 
			buffer->first_time, last_time, &buffer->ncoeff,
                        &buffer->ncoefft, buffer->b, &buffer->foutput,
                        &buffer->co, &buffer->mem, buffer->state, &buffer->fsize);
    if (!dsdata) {
      Fprintf(stderr, "can't get downsampled data.\n");
      return 1;
    }
  }

  /* Get a function of the "stationarity" of the speech signal. */

  stat = get_stationarity(fdata, freq, buff_size, nframes, buffer->step, buffer->first_time,
                          buffer);
  if (!stat) { 
    Fprintf(stderr, "can't get stationarity\n");
    return(1);
  }
  sta = stat->stat;
  rms_ratio = stat->rms_ratio;

  /***********************************************************************/
  /* MAIN FUNDAMENTAL FREQUENCY ESTIMATION LOOP */
  /***********************************************************************/
  if(!buffer->first_time && nframes > 0) buffer->headF = buffer->headF->next;

  for(i = 0; i < nframes; i++) {
 
    /* NOTE: This buffer growth provision is probably not necessary.
       It was put in (with errors) by Derek Lin and apparently never
       tested.  My tests and analysis suggest it is completely
       superfluous. DT 9/5/96 */
    /* Dynamically allocating more space for the circular buffer */
    if(buffer->headF == buffer->tailF->prev){
      Frame *frm;

      if(buffer->cir_buff_growth_count > 5){
	Fprintf(stderr,
		"too many requests (%d) for dynamically allocating space.\n   There may be a problem in finding converged path.\n",buffer->cir_buff_growth_count);
	return(1);
      }
      if(debug_level) 
	Fprintf(stderr, "allocating %d more frames for DP circ. buffer.\n", buffer->size_cir_buffer);
      frm = alloc_frame(buffer->nlags, par->n_cands);
      buffer->headF->next = frm;
      frm->prev = buffer->headF;
      for(k=1; k<buffer->size_cir_buffer; k++){
	frm->next = alloc_frame(buffer->nlags, par->n_cands);
	frm->next->prev = frm;
	frm = frm->next;
      }
      frm->next = buffer->tailF;
      buffer->tailF->prev = frm;
      buffer->cir_buff_growth_count++;
    }

    buffer->headF->rms = stat->rms[i];
    get_fast_cands(fdata, dsdata, i, buffer->step, buffer->size, decimate, buffer->start,
		   buffer->nlags, &engref, &maxloc,
		   &maxval, buffer->headF->cp, buffer->peaks, buffer->locs, &ncand, par,
		   &buffer->dbsize, &buffer->dbdata);
    
    /*    Move the peak value and location arrays into the dp structure */
    {
      register float *ftp1, *ftp2;
      register short *sp1;
      register int *sp2;
      
      for(ftp1 = buffer->headF->dp->pvals, ftp2 = buffer->peaks,
	  sp1 = buffer->headF->dp->locs, sp2 = buffer->locs, j=ncand; j--; ) {
	*ftp1++ = *ftp2++;
	*sp1++ = *sp2++;
      }
      *sp1 = -1;		/* distinguish the UNVOICED candidate */
      *ftp1 = maxval;
      buffer->headF->dp->mpvals[ncand] = buffer->vbias+maxval; /* (high cost if cor. is high)*/
    }

    /* Apply a lag-dependent weight to the peaks to encourage the selection
       of the first major peak.  Translate the modified peak values into
       costs (high peak ==> low cost). */
    for(j=0; j < ncand; j++){
      ftemp = 1.0f - ((float)buffer->locs[j] * buffer->lagwt);
      buffer->headF->dp->mpvals[j] = 1.0f - (buffer->peaks[j] * ftemp);
    }
    ncand++;			/* include the unvoiced candidate */
    buffer->headF->dp->ncands = ncand;

    /*********************************************************************/
    /*    COMPUTE THE DISTANCE MEASURES AND ACCUMULATE THE COSTS.       */
    /*********************************************************************/

    ncandp = buffer->headF->prev->dp->ncands;
    for(k=0; k<ncand; k++){	/* for each of the current candidates... */
      minloc = 0;
      errmin = FLT_MAX;
      if((loc2 = buffer->headF->dp->locs[k]) > 0) { /* current cand. is voiced */
	for(j=0; j<ncandp; j++){ /* for each PREVIOUS candidate... */
	  /*    Get cost due to inter-frame period change. */
	  loc1 = buffer->headF->prev->dp->locs[j];
	  if (loc1 > 0) { /* prev. was voiced */
	    ftemp = (float) log(((double) loc2) / loc1);
	    ttemp = (float) fabs(ftemp);
	    ft1 = (float) (buffer->fdouble + fabs(ftemp + buffer->ln2));
	    if (ttemp > ft1)
	      ttemp = ft1;
	    ft1 = (float) (buffer->fdouble + fabs(ftemp - buffer->ln2));
	    if (ttemp > ft1)
	      ttemp = ft1;
	    ferr = ttemp * buffer->freqwt;
	  } else {		/* prev. was unvoiced */
	    ferr = buffer->tcost + (buffer->tfact_s * sta[i]) + (buffer->tfact_a / rms_ratio[i]);
	  }
	  /*    Add in cumulative cost associated with previous peak. */
	  err = ferr + buffer->headF->prev->dp->dpvals[j];
	  if(err < errmin){	/* find min. cost */
	    errmin = err;
	    minloc = j;
	  }
	}
      } else {			/* this is the unvoiced candidate */
	for(j=0; j<ncandp; j++){ /* for each PREVIOUS candidate... */
	  
	  /*    Get voicing transition cost. */
	  if (buffer->headF->prev->dp->locs[j] > 0) { /* previous was voiced */
	    ferr = buffer->tcost + (buffer->tfact_s * sta[i]) + (buffer->tfact_a * rms_ratio[i]);
	  }
	  else
	    ferr = 0.0;
	  /*    Add in cumulative cost associated with previous peak. */
	  err = ferr + buffer->headF->prev->dp->dpvals[j];
	  if(err < errmin){	/* find min. cost */
	    errmin = err;
	    minloc = j;
	  }
	}
      }
      /* Now have found the best path from this cand. to prev. frame */
      if (buffer->first_time && i==0) {		/* this is the first frame */
	buffer->headF->dp->dpvals[k] = buffer->headF->dp->mpvals[k];
	buffer->headF->dp->prept[k] = 0;
      } else {
	buffer->headF->dp->dpvals[k] = errmin + buffer->headF->dp->mpvals[k];
	buffer->headF->dp->prept[k] = minloc;
      }
    } /*    END OF THIS DP FRAME */

    if (i < nframes - 1)
      buffer->headF = buffer->headF->next;
    
    if (debug_level >= 2) {
      Fprintf(stderr,"%d engref:%10.0f max:%7.5f loc:%4d\n",
	      i,engref,maxval,maxloc);
    }
    
  } /* end for (i ...) */

  /***************************************************************/
  /* DONE WITH FILLING DP STRUCTURES FOR THE SET OF SAMPLED DATA */
  /*    NOW FIND A CONVERGED DP PATH                             */
  /***************************************************************/

  *vecsize = 0;			/* # of output frames returned */

  buffer->num_active_frames += nframes;

  if( buffer->num_active_frames >= buffer->size_frame_hist  || last_time ){
    Frame *frm;
    int  num_paths, best_cand, frmcnt, checkpath_done = 1;
    float patherrmin;
      
    if(debug_level)
      Fprintf(stderr, "available frames for backtracking: %d\n",
buffer->num_active_frames);
      
    patherrmin = FLT_MAX;
    best_cand = 0;
    num_paths = buffer->headF->dp->ncands;

    /* Get the best candidate for the final frame and initialize the
       paths' backpointers. */
    frm = buffer->headF;
    for(k=0; k < num_paths; k++) {
      if (patherrmin > buffer->headF->dp->dpvals[k]){
	patherrmin = buffer->headF->dp->dpvals[k];
	best_cand = k;	/* index indicating the best candidate at a path */
      }
      buffer->pcands[k] = frm->dp->prept[k];
    }

    if(last_time){     /* Input data was exhausted. force final outputs. */
      buffer->cmpthF = buffer->headF;		/* Use the current frame as starting point. */
    } else {
      /* Starting from the most recent frame, trace back each candidate's
	 best path until reaching a common candidate at some past frame. */
      frmcnt = 0;
      while (1) {
	frm = frm->prev;
	frmcnt++;
	checkpath_done = 1;
	for(k=1; k < num_paths; k++){ /* Check for convergence. */
	  if(buffer->pcands[0] != buffer->pcands[k])
	    checkpath_done = 0;
	}
	if( ! checkpath_done) { /* Prepare for checking at prev. frame. */
	  for(k=0; k < num_paths; k++){
	    buffer->pcands[k] = frm->dp->prept[buffer->pcands[k]];
	  }
	} else {	/* All paths have converged. */
	  buffer->cmpthF = frm;
	  best_cand = buffer->pcands[0];
	  if(debug_level)
	    Fprintf(stderr,
		    "paths went back %d frames before converging\n",frmcnt);
	  break;
	}
	if(frm == buffer->tailF){	/* Used all available data? */
	  if( buffer->num_active_frames < buffer->size_frame_out) { /* Delay some more? */
	    checkpath_done = 0; /* Yes, don't backtrack at this time. */
	    buffer->cmpthF = NULL;
	  } else {		/* No more delay! Force best-guess output. */
	    checkpath_done = 1;
	    buffer->cmpthF = buffer->headF;
	    /*	    Fprintf(stderr,
		    "WARNING: no converging path found after going back %d frames, will use the lowest cost path\n",num_active_frames);*/
	  }
	  break;
	} /* end if (frm ...) */
      }	/* end while (1) */
    } /* end if (last_time) ... else */

    /*************************************************************/
    /* BACKTRACKING FROM cmpthF (best_cand) ALL THE WAY TO tailF    */
    /*************************************************************/
    i = 0;
    frm = buffer->cmpthF;	/* Start where convergence was found (or faked). */
    while( frm != buffer->tailF->prev && checkpath_done){
      if( i == buffer->output_buf_size ){ /* Need more room for outputs? */
	buffer->output_buf_size *= 2;
	if(debug_level)
	  Fprintf(stderr,
		  "reallocating space for output frames: %d\n",
		  buffer->output_buf_size);
	buffer->rms_speech = (float *) ckrealloc((void *) buffer->rms_speech,
				       sizeof(float) * buffer->output_buf_size);
	/*	spsassert(rms_speech, "rms_speech realloc failed in dp_f0()");*/
	buffer->f0p = (float *) ckrealloc((void *) buffer->f0p,
				sizeof(float) * buffer->output_buf_size);
	/*	spsassert(f0p, "f0p realloc failed in dp_f0()");*/
	buffer->vuvp = (float *) ckrealloc((void *) buffer->vuvp, sizeof(float) * buffer->output_buf_size);
	/*	spsassert(vuvp, "vuvp realloc failed in dp_f0()");*/
	buffer->acpkp = (float *) ckrealloc((void *) buffer->acpkp, sizeof(float) * buffer->output_buf_size);
	/*	spsassert(acpkp, "acpkp realloc failed in dp_f0()");*/
      }
      buffer->rms_speech[i] = frm->rms;
      buffer->acpkp[i] =  frm->dp->pvals[best_cand];
      loc1 = frm->dp->locs[best_cand];
      buffer->vuvp[i] = 1.0;
      best_cand = frm->dp->prept[best_cand];
      ftemp = (float) loc1;
      if(loc1 > 0) {		/* Was f0 actually estimated for this frame? */
	if (loc1 > buffer->start && loc1 < buffer->stop) { /* loc1 must be a local maximum. */
	  float cormax, cprev, cnext, den;
		  
	  j = loc1 - buffer->start;
	  cormax = frm->cp->correl[j];
	  cprev = frm->cp->correl[j+1];
	  cnext = frm->cp->correl[j-1];
	  den = (float) (2.0 * ( cprev + cnext - (2.0 * cormax) ));
	  /*
	   * Only parabolic interpolate if cormax is indeed a local 
	   * turning point. Find peak of curve that goes though the 3 points
	   */
		  
	  if (fabs(den) > 0.000001)
	    ftemp += 2.0f - ((((5.0f*cprev)+(3.0f*cnext)-(8.0f*cormax))/den));
	}
	buffer->f0p[i] = (float) (freq/ftemp);
      } else {		/* No valid estimate; just fake some arbitrary F0. */
	buffer->f0p[i] = 0;
	buffer->vuvp[i] = 0.0;
      }
      frm = frm->prev;
	  
      if (debug_level >= 2)
	Fprintf(stderr," i:%4d%8.1f%8.1f\n",i,buffer->f0p[i],buffer->vuvp[i]);
      /* f0p[i] starts from the most recent one */ 
      /* Need to reverse the order in the calling function */
      i++;
    } /* end while() */
    if (checkpath_done){
      *vecsize = i;
      buffer->tailF = buffer->cmpthF->next;
      buffer->num_active_frames -= *vecsize;
    }
  } /* end if() */

  if (debug_level)
    Fprintf(stderr, "writing out %d frames.\n", *vecsize);
  
  *f0p_pt = buffer->f0p;
  *vuvp_pt = buffer->vuvp;
  *acpkp_pt = buffer->acpkp;
  *rms_speech_pt = buffer->rms_speech;
  /*  *acpkp_pt = acpkp;*/
  
  if(buffer->first_time) buffer->first_time = 0;
  return(0);
}